

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O1

int check_utf8_sequences(void)

{
  int iVar1;
  int iVar2;
  test_case *ptVar3;
  long lVar4;
  uint uVar5;
  size_t size;
  uchar *input;
  yaml_parser_t parser;
  yaml_parser_t local_210;
  
  puts("checking utf-8 sequences...");
  if (utf8_sequences[0].test == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    ptVar3 = utf8_sequences;
    lVar4 = 0;
    uVar5 = 0;
    input = (uchar *)utf8_sequences[0].test;
    do {
      iVar1 = ptVar3->result;
      printf("\t%s:\n",ptVar3->title);
      while( true ) {
        for (size = 0; (input[size] != '!' && (input[size] != '|')); size = size + 1) {
        }
        yaml_parser_initialize(&local_210);
        yaml_parser_set_input_string(&local_210,input,size);
        iVar2 = yaml_parser_update_buffer(&local_210,size);
        if (iVar2 == iVar1) {
          printf("\t\t+ ");
        }
        else {
          printf("\t\t- ");
          uVar5 = uVar5 + 1;
        }
        if (local_210.error == YAML_READER_ERROR) {
          if (local_210.problem_value == 0xffffffff) {
            printf("(reader error: %s at %ld)\n",local_210.problem,local_210.problem_offset);
          }
          else {
            printf("(reader error: %s: #%X at %ld)\n",local_210.problem,
                   (ulong)(uint)local_210.problem_value,local_210.problem_offset);
          }
        }
        else if (local_210.error == YAML_NO_ERROR) {
          puts("(no error)");
        }
        if (input[size] == '!') break;
        input = input + size + 1;
        yaml_parser_delete(&local_210);
      }
      putchar(10);
      lVar4 = lVar4 + 1;
      ptVar3 = utf8_sequences + lVar4;
      input = (uchar *)utf8_sequences[lVar4].test;
    } while (input != (uchar *)0x0);
  }
  printf("checking utf-8 sequences: %d fail(s)\n",(ulong)uVar5);
  return uVar5;
}

Assistant:

int check_utf8_sequences(void)
{
    yaml_parser_t parser;
    int failed = 0;
    int k;
    printf("checking utf-8 sequences...\n");
    for (k = 0; utf8_sequences[k].test; k++) {
        char *title = utf8_sequences[k].title;
        int check = utf8_sequences[k].result;
        int result;
        char *start = utf8_sequences[k].test;
        char *end = start;
        printf("\t%s:\n", title);
        while(1) {
            while (*end != '|' && *end != '!') end++;
            yaml_parser_initialize(&parser);
            yaml_parser_set_input_string(&parser, (unsigned char *)start, end-start);
            result = yaml_parser_update_buffer(&parser, end-start);
            if (result != check) {
                printf("\t\t- ");
                failed ++;
            }
            else {
                printf("\t\t+ ");
            }
            if (!parser.error) {
                printf("(no error)\n");
            }
            else if (parser.error == YAML_READER_ERROR) {
                if (parser.problem_value != -1) {
                    printf("(reader error: %s: #%X at %ld)\n",
                            parser.problem, parser.problem_value, (long)parser.problem_offset);
                }
                else {
                    printf("(reader error: %s at %ld)\n",
                            parser.problem, (long)parser.problem_offset);
                }
            }
            if (*end == '!') break;
            start = ++end;
            yaml_parser_delete(&parser);
        };
        printf("\n");
    }
    printf("checking utf-8 sequences: %d fail(s)\n", failed);
    return failed;
}